

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

make_tuple_string<std::tuple<char,int,double,char_const*>,2ul> * __thiscall
lest::make_tuple_string<std::tuple<char,int,double,char_const*>,2ul>::make_abi_cxx11_
          (make_tuple_string<std::tuple<char,int,double,char_const*>,2ul> *this,
          tuple<char,_int,_double,_const_char_*> *tuple)

{
  __tuple_element_t<1UL,_tuple<char,_int,_double,_const_char_*>_> *value;
  ostream *poVar1;
  string local_220 [32];
  make_tuple_string<std::tuple<char,int,double,char_const*>,1ul> local_200 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0 [48];
  lest local_1b0 [32];
  ostringstream local_190 [8];
  ostringstream os;
  tuple<char,_int,_double,_const_char_*> *tuple_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  value = std::get<1ul,char,int,double,char_const*>(tuple);
  to_string<int>(local_1b0,value);
  poVar1 = std::operator<<((ostream *)local_190,(string *)local_1b0);
  std::operator<<(poVar1,", ");
  std::__cxx11::string::~string((string *)local_1b0);
  make_tuple_string<std::tuple<char,int,double,char_const*>,1ul>::make_abi_cxx11_(local_200,tuple);
  std::__cxx11::ostringstream::str();
  std::operator+(local_1e0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_200);
  std::__cxx11::string::string((string *)this,(string *)local_1e0);
  std::__cxx11::string::~string((string *)local_1e0);
  std::__cxx11::string::~string(local_220);
  std::__cxx11::string::~string((string *)local_200);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return this;
}

Assistant:

static std::string make( TU const & tuple )
    {
        std::ostringstream os;
        os << to_string( std::get<N - 1>( tuple ) ) << ( N < std::tuple_size<TU>::value ? ", ": " ");
        return make_tuple_string<TU, N - 1>::make( tuple ) + os.str();
    }